

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinition.cpp
# Opt level: O3

bool deqp::gles31::Functional::ProgramInterfaceDefinition::isIllegalVertexOutput
               (VarType *varType,bool insideAStruct,bool insideAnArray)

{
  Type TVar1;
  DataType DVar2;
  pointer pSVar3;
  bool bVar4;
  byte bVar5;
  ulong uVar6;
  VarType *varType_00;
  uint uVar7;
  ulong uVar8;
  
  for (; TVar1 = varType->m_type, TVar1 == TYPE_ARRAY; varType = (varType->m_data).array.elementType
      ) {
    if (((insideAStruct | insideAnArray) & 1U) != 0) {
      bVar5 = 1;
      goto LAB_0169d81c;
    }
    insideAnArray = true;
    insideAStruct = false;
  }
  if (TVar1 == TYPE_BASIC) {
    DVar2 = (varType->m_data).basic.type;
    uVar7 = DVar2 - TYPE_FLOAT;
    if ((uVar7 < 0x23) && ((0x7fc01e00fU >> ((ulong)uVar7 & 0x3f) & 1) != 0)) {
      bVar5 = (byte)(0x400000000 >> ((byte)uVar7 & 0x3f));
    }
    else {
      bVar5 = 1;
      if (2 < DVar2 - TYPE_BOOL_VEC2) {
        bVar5 = DVar2 - TYPE_INT < 0xfffffff7 && DVar2 - TYPE_DOUBLE < 0xfffffff7;
      }
    }
  }
  else {
    bVar5 = 1;
    if (((insideAnArray | insideAStruct) & 1U) == 0 && TVar1 == TYPE_STRUCT) {
      pSVar3 = (((varType->m_data).structPtr)->m_members).
               super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = (int)((long)(((varType->m_data).structPtr)->m_members).
                          super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 3) *
              -0x49249249;
      if ((int)uVar7 < 1) {
        bVar5 = 0;
      }
      else {
        uVar8 = (ulong)(uVar7 & 0x7fffffff);
        varType_00 = &pSVar3->m_type;
        uVar6 = 0;
        do {
          bVar4 = isIllegalVertexOutput(varType_00,true,false);
          if (bVar4) goto LAB_0169d81c;
          uVar6 = uVar6 + 1;
          varType_00 = (VarType *)&varType_00[2].m_data;
        } while (uVar8 != uVar6);
        bVar5 = uVar6 < uVar8;
      }
    }
  }
LAB_0169d81c:
  return (bool)(bVar5 & 1);
}

Assistant:

static bool isIllegalVertexOutput (const glu::VarType& varType, bool insideAStruct = false, bool insideAnArray = false)
{
	// booleans, opaque types, arrays of arrays, arrays of structs, array in struct, struct struct are not allowed as vertex outputs

	if (varType.isBasicType())
	{
		const bool isOpaqueType = !glu::isDataTypeScalar(varType.getBasicType()) && !glu::isDataTypeVector(varType.getBasicType()) && !glu::isDataTypeMatrix(varType.getBasicType());

		if (glu::isDataTypeBoolOrBVec(varType.getBasicType()))
			return true;

		if (isOpaqueType)
			return true;

		return false;
	}
	else if (varType.isArrayType())
	{
		if (insideAnArray || insideAStruct)
			return true;

		return isIllegalVertexOutput(varType.getElementType(), insideAStruct, true);
	}
	else if (varType.isStructType())
	{
		if (insideAnArray || insideAStruct)
			return true;

		for (int ndx = 0; ndx < varType.getStructPtr()->getNumMembers(); ++ndx)
			if (isIllegalVertexOutput(varType.getStructPtr()->getMember(ndx).getType(), true, insideAnArray))
				return true;

		return false;
	}
	else
	{
		DE_ASSERT(false);
		return true;
	}
}